

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

void __thiscall QPDFObjectHandle::pipePageContents(QPDFObjectHandle *this,Pipeline *p)

{
  element_type *peVar1;
  allocator<char> local_89;
  QPDFObjectHandle local_88;
  string all_description;
  QPDFObjGen local_58 [4];
  string description;
  
  peVar1 = (this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    local_58[0].obj = 0;
    local_58[0].gen = 0;
  }
  else {
    local_58[0] = peVar1->og;
  }
  QPDFObjGen::unparse_abi_cxx11_(&all_description,local_58,' ');
  std::operator+(&description,"page object ",&all_description);
  std::__cxx11::string::~string((string *)&all_description);
  all_description._M_dataplus._M_p = (pointer)&all_description.field_2;
  all_description._M_string_length = 0;
  all_description.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)local_58,"/Contents",&local_89);
  getKey(&local_88,(string *)this);
  pipeContentStreams(&local_88,p,&description,&all_description);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_88.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)&all_description);
  std::__cxx11::string::~string((string *)&description);
  return;
}

Assistant:

void
QPDFObjectHandle::pipePageContents(Pipeline* p)
{
    std::string description = "page object " + getObjGen().unparse(' ');
    std::string all_description;
    this->getKey("/Contents").pipeContentStreams(p, description, all_description);
}